

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O0

void skip_bios(arm7tdmi_t *state)

{
  long in_RDI;
  arm7tdmi_t *in_stack_fffffffffffffc40;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0,0x8000000);
  }
  *(undefined4 *)(in_RDI + 0x38) = 0x8000000;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",1,0xea);
  }
  *(undefined4 *)(in_RDI + 0x3c) = 0xea;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",2,0);
  }
  *(undefined4 *)(in_RDI + 0x40) = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",3,0);
  }
  *(undefined4 *)(in_RDI + 0x44) = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",4,0);
  }
  *(undefined4 *)(in_RDI + 0x48) = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",5,0);
  }
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",6,0);
  }
  *(undefined4 *)(in_RDI + 0x50) = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",7,0);
  }
  *(undefined4 *)(in_RDI + 0x54) = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",8,0);
  }
  if ((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) {
    *(undefined4 *)(in_RDI + 0x6c) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x58) = 0;
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",9,0);
  }
  if ((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) {
    *(undefined4 *)(in_RDI + 0x70) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x5c) = 0;
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",10,0);
  }
  if ((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) {
    *(undefined4 *)(in_RDI + 0x74) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x60) = 0;
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xb,0);
  }
  if ((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) {
    *(undefined4 *)(in_RDI + 0x78) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 100) = 0;
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xc,0);
  }
  if ((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) {
    *(undefined4 *)(in_RDI + 0x7c) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x68) = 0;
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xd,0x3007f00);
  }
  switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
  case 0x11:
    *(undefined4 *)(in_RDI + 0x84) = 0x3007f00;
    break;
  case 0x12:
    *(undefined4 *)(in_RDI + 0x90) = 0x3007f00;
    break;
  case 0x13:
    *(undefined4 *)(in_RDI + 0x88) = 0x3007f00;
    break;
  default:
    *(undefined4 *)(in_RDI + 0x80) = 0x3007f00;
    break;
  case 0x17:
    *(undefined4 *)(in_RDI + 0x8c) = 0x3007f00;
    break;
  case 0x1b:
    *(undefined4 *)(in_RDI + 0x94) = 0x3007f00;
  }
  *(undefined4 *)(in_RDI + 0x90) = 0x3007fa0;
  *(undefined4 *)(in_RDI + 0x88) = 0x3007fe0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xe,0);
  }
  switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
  case 0x11:
    *(undefined4 *)(in_RDI + 0x9c) = 0;
    break;
  case 0x12:
    *(undefined4 *)(in_RDI + 0xa8) = 0;
    break;
  case 0x13:
    *(undefined4 *)(in_RDI + 0xa0) = 0;
    break;
  default:
    *(undefined4 *)(in_RDI + 0x98) = 0;
    break;
  case 0x17:
    *(undefined4 *)(in_RDI + 0xa4) = 0;
    break;
  case 0x1b:
    *(undefined4 *)(in_RDI + 0xac) = 0;
  }
  set_pc(in_stack_fffffffffffffc40,0);
  *(undefined4 *)(in_RDI + 0xb4) = 0x6000001f;
  return;
}

Assistant:

void skip_bios(arm7tdmi_t* state) {
    set_register(state, 0, 0x08000000);
    set_register(state, 1, 0x000000EA);
    set_register(state, 2, 0x00000000);
    set_register(state, 3, 0x00000000);
    set_register(state, 4, 0x00000000);
    set_register(state, 5, 0x00000000);
    set_register(state, 6, 0x00000000);
    set_register(state, 7, 0x00000000);
    set_register(state, 8, 0x00000000);
    set_register(state, 9, 0x00000000);
    set_register(state, 10, 0x00000000);
    set_register(state, 11, 0x00000000);
    set_register(state, 12, 0x00000000);
    set_register(state, REG_SP, 0x03007F00);
    state->sp_irq = 0x3007FA0;
    state->sp_svc = 0x3007FE0;
    set_register(state, REG_LR, 0x00000000);

    set_pc(state, 0x08000000);
    state->cpsr.raw = 0x6000001F;
}